

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O2

int64_t yactfr::internal::anon_unknown_0::readFlSIntBe37At5(uint8_t *buf)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)((uint)buf[2] | (uint)buf[1] << 8 | (*buf & 7) << 0x10) << 0x12;
  uVar2 = ((uint)(buf[5] >> 6) | (uint)buf[3] * 0x400 + (uint)buf[4] * 4) | uVar3;
  uVar1 = uVar2 | 0xffffffe000000000;
  if (uVar3 >> 0x24 == 0) {
    uVar1 = uVar2;
  }
  return uVar1;
}

Assistant:

std::int64_t readFlSIntBe37At5(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 8;
    res |= buf[1];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[4];
    res <<= 2;
    res |= (buf[5] >> 6);
    res &= UINT64_C(0x1fffffffff);

    if (res >> 36) {
        res |= UINT64_C(0xffffffe000000000);
    }

    return static_cast<std::int64_t>(res);
}